

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O0

void * rollback_during_ops_test(void *args)

{
  uint *in_RDI;
  int n;
  int r;
  int i;
  char str [15];
  bool walflush;
  void *thread_ret;
  pthread_t tid;
  fdb_seqnum_t rollback_to;
  fdb_kvs_info kvs_info;
  fdb_kvs_config kvs_config;
  fdb_config config;
  fdb_status status;
  fdb_kvs_handle *kvs;
  fdb_file_handle *file;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_file_handle *in_stack_fffffffffffffbc8;
  fdb_file_handle *in_stack_fffffffffffffbd0;
  fdb_file_handle *in_stack_fffffffffffffbe8;
  char *in_stack_fffffffffffffbf0;
  size_t in_stack_fffffffffffffbf8;
  void *in_stack_fffffffffffffc00;
  fdb_kvs_handle *in_stack_fffffffffffffc08;
  undefined1 local_3f0 [224];
  fdb_seqnum_t in_stack_fffffffffffffcf0;
  fdb_kvs_handle **in_stack_fffffffffffffcf8;
  undefined1 local_2e0 [16];
  fdb_kvs_info *in_stack_fffffffffffffd30;
  fdb_kvs_handle *in_stack_fffffffffffffd38;
  fdb_config *in_stack_fffffffffffffde8;
  char *in_stack_fffffffffffffdf0;
  fdb_file_handle **in_stack_fffffffffffffdf8;
  uint local_1e4;
  int local_1e0;
  uint local_1dc;
  char local_1d8 [15];
  byte local_1c9;
  void *local_1c8;
  pthread_t local_1c0;
  long local_1b8;
  long local_1a8;
  undefined1 local_168 [184];
  undefined8 local_b0;
  fdb_status local_6c;
  fdb_file_handle *local_68;
  __time_t local_38;
  __suseconds_t local_30;
  timeval local_18;
  uint *local_8;
  
  local_8 = in_RDI;
  gettimeofday(&local_18,(__timezone_ptr_t)0x0);
  local_38 = local_18.tv_sec;
  local_30 = local_18.tv_usec;
  memleak_start();
  local_1c9 = 1;
  local_1e4 = 10000;
  if (local_8 != (uint *)0x0) {
    fdb_get_default_config();
    memcpy(local_168,local_3f0,0xf8);
    local_b0 = 0;
    local_6c = fdb_open(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                        in_stack_fffffffffffffde8);
    if (local_6c != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x134d);
      rollback_during_ops_test::__test_pass = 0;
      if (local_6c != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x134d,"void *rollback_during_ops_test(void *)");
      }
    }
    fdb_get_default_kvs_config();
    local_6c = fdb_kvs_open_default
                         (in_stack_fffffffffffffbd0,&in_stack_fffffffffffffbc8->root,
                          (fdb_kvs_config *)0x120e9b);
    if (local_6c != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x1350);
      rollback_during_ops_test::__test_pass = 0;
      if (local_6c != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x1350,"void *rollback_during_ops_test(void *)");
      }
    }
    local_1e4 = *local_8;
    local_1dc = local_1e4;
    do {
      if ((int)local_1dc < 2) {
        fdb_close(in_stack_fffffffffffffbc8);
        pthread_exit((void *)0x0);
      }
      sprintf(local_1d8,"%d",(ulong)local_1dc);
      in_stack_fffffffffffffbc8 = local_68;
      strlen(local_1d8);
      local_6c = fdb_set_kv(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                            in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,
                            (size_t)in_stack_fffffffffffffbe8);
      if (local_6c != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x1357);
        rollback_during_ops_test::__test_pass = 0;
        if (local_6c != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x1357,"void *rollback_during_ops_test(void *)");
        }
      }
      if (((int)local_1dc % 10 == 0) &&
         (local_6c = fdb_rollback(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0),
         local_6c != FDB_RESULT_SUCCESS)) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x135a);
        rollback_during_ops_test::__test_pass = 0;
        if (local_6c != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x135a,"void *rollback_during_ops_test(void *)");
        }
      }
      local_1dc = local_1dc - 1;
    } while( true );
  }
  local_1e0 = system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_get_default_config();
  memcpy(local_168,local_2e0,0xf8);
  local_b0 = 0;
  local_6c = fdb_open(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8)
  ;
  if (local_6c != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x12fc);
    rollback_during_ops_test::__test_pass = 0;
    if (local_6c != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x12fc,"void *rollback_during_ops_test(void *)");
    }
  }
  fdb_get_default_kvs_config();
  local_6c = fdb_kvs_open_default
                       (in_stack_fffffffffffffbd0,&in_stack_fffffffffffffbc8->root,
                        (fdb_kvs_config *)0x12050f);
  if (local_6c != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x1301);
    rollback_during_ops_test::__test_pass = 0;
    if (local_6c != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x1301,"void *rollback_during_ops_test(void *)");
    }
  }
  local_1dc = 1;
  do {
    if ((int)local_1e4 < (int)local_1dc) {
      fdb_commit(in_stack_fffffffffffffbc8,'\0');
      fdb_get_kvs_info(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
      if (local_1a8 != (int)local_1e4) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x1314);
        rollback_during_ops_test::__test_pass = 0;
        if (local_1a8 != (int)local_1e4) {
          __assert_fail("kvs_info.last_seqnum == (uint64_t)n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x1314,"void *rollback_during_ops_test(void *)");
        }
      }
      pthread_create(&local_1c0,(pthread_attr_t *)0x0,rollback_during_ops_test,&local_1e4);
      local_1dc = 1;
      do {
        if (10000 < (int)local_1dc) {
          pthread_join(local_1c0,&local_1c8);
          local_6c = fdb_set_kv(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                                in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,
                                (size_t)in_stack_fffffffffffffbe8);
          if (local_6c != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x132c);
            rollback_during_ops_test::__test_pass = 0;
            if (local_6c != FDB_RESULT_SUCCESS) {
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                            ,0x132c,"void *rollback_during_ops_test(void *)");
            }
          }
          local_6c = fdb_commit(in_stack_fffffffffffffbc8,'\0');
          if (local_6c != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x132e);
            rollback_during_ops_test::__test_pass = 0;
            if (local_6c != FDB_RESULT_SUCCESS) {
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                            ,0x132e,"void *rollback_during_ops_test(void *)");
            }
          }
          fdb_get_kvs_info(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
          local_1b8 = local_1a8;
          local_6c = fdb_set_kv(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                                in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,
                                (size_t)in_stack_fffffffffffffbe8);
          if (local_6c != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x1334);
            rollback_during_ops_test::__test_pass = 0;
            if (local_6c != FDB_RESULT_SUCCESS) {
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                            ,0x1334,"void *rollback_during_ops_test(void *)");
            }
          }
          local_6c = fdb_set_kv(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                                in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,
                                (size_t)in_stack_fffffffffffffbe8);
          if (local_6c != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x1336);
            rollback_during_ops_test::__test_pass = 0;
            if (local_6c != FDB_RESULT_SUCCESS) {
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                            ,0x1336,"void *rollback_during_ops_test(void *)");
            }
          }
          local_6c = fdb_commit(in_stack_fffffffffffffbc8,'\0');
          if (local_6c != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x1338);
            rollback_during_ops_test::__test_pass = 0;
            if (local_6c != FDB_RESULT_SUCCESS) {
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                            ,0x1338,"void *rollback_during_ops_test(void *)");
            }
          }
          local_6c = fdb_rollback(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
          if (local_6c != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x133c);
            rollback_during_ops_test::__test_pass = 0;
            if (local_6c != FDB_RESULT_SUCCESS) {
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                            ,0x133c,"void *rollback_during_ops_test(void *)");
            }
          }
          fdb_get_kvs_info(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
          if (local_1a8 != local_1b8) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x133e);
            rollback_during_ops_test::__test_pass = 0;
            if (local_1a8 != local_1b8) {
              __assert_fail("kvs_info.last_seqnum == rollback_to",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                            ,0x133e,"void *rollback_during_ops_test(void *)");
            }
          }
          fdb_close(in_stack_fffffffffffffbc8);
          fdb_shutdown();
          memleak_end();
          if (rollback_during_ops_test::__test_pass == 0) {
            fprintf(_stderr,"%s FAILED\n","rollback during ops test");
          }
          else {
            fprintf(_stderr,"%s PASSED\n","rollback during ops test");
          }
          return (void *)0x0;
        }
        sprintf(local_1d8,"%d",(ulong)local_1dc);
        strlen(local_1d8);
        local_6c = fdb_set_kv(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                              in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,
                              (size_t)in_stack_fffffffffffffbe8);
        if (local_6c == FDB_RESULT_SUCCESS) {
          local_6c = fdb_commit(in_stack_fffffffffffffbc8,'\0');
          if ((local_6c != FDB_RESULT_SUCCESS) && (local_6c != FDB_RESULT_FAIL_BY_ROLLBACK)) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x1320);
            rollback_during_ops_test::__test_pass = 0;
            if (local_6c != FDB_RESULT_FAIL_BY_ROLLBACK) {
              __assert_fail("status == FDB_RESULT_FAIL_BY_ROLLBACK",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                            ,0x1320,"void *rollback_during_ops_test(void *)");
            }
          }
        }
        else if (local_6c != FDB_RESULT_FAIL_BY_ROLLBACK) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x1323);
          rollback_during_ops_test::__test_pass = 0;
          if (local_6c != FDB_RESULT_FAIL_BY_ROLLBACK) {
            __assert_fail("status == FDB_RESULT_FAIL_BY_ROLLBACK",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0x1323,"void *rollback_during_ops_test(void *)");
          }
        }
        local_1dc = local_1dc + 1;
      } while( true );
    }
    sprintf(local_1d8,"%d",(ulong)local_1dc);
    in_stack_fffffffffffffbf0 = local_1d8;
    in_stack_fffffffffffffbe8 = local_68;
    strlen(local_1d8);
    local_6c = fdb_set_kv(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                          in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,
                          (size_t)in_stack_fffffffffffffbe8);
    if (local_6c != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x1307);
      rollback_during_ops_test::__test_pass = 0;
      if (local_6c != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x1307,"void *rollback_during_ops_test(void *)");
      }
    }
    if ((int)local_1dc % 10 == 0) {
      local_1c9 = (local_1c9 ^ 0xff) & 1;
      if (local_1c9 == 0) {
        fdb_commit(in_stack_fffffffffffffbc8,'\0');
      }
      else {
        fdb_commit(in_stack_fffffffffffffbc8,'\0');
      }
    }
    local_1dc = local_1dc + 1;
  } while( true );
}

Assistant:

void *rollback_during_ops_test(void * args)
{

    TEST_INIT();
    memleak_start();

    fdb_file_handle *file;
    fdb_kvs_handle *kvs;
    fdb_status status;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_kvs_info kvs_info;
    fdb_seqnum_t rollback_to;
    thread_t tid;
    void *thread_ret;
    bool walflush = true;
    char str[15];
    int i, r;
    int n = 10000;

    if (args == NULL)
    { // parent

        r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
        (void)r;

        // Open Database File
        config = fdb_get_default_config();
        // disable block reusing for strict rollback
        config.block_reusing_threshold = 0;
        status = fdb_open(&file, "mvcc_test1", &config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // Open KV Store
        kvs_config = fdb_get_default_kvs_config();
        status = fdb_kvs_open_default(file, &kvs, &kvs_config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // set with commits
        for(i=1;i<=n;i++) {
            sprintf(str, "%d", i);
            status = fdb_set_kv(kvs, str, strlen(str), (void*)"value", 5);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            if(i%10==0){
                walflush = !walflush;
                if(walflush){
                    fdb_commit(file, FDB_COMMIT_MANUAL_WAL_FLUSH);
                } else {
                    fdb_commit(file, FDB_COMMIT_NORMAL);
                }
            }
        }

        fdb_commit(file, FDB_COMMIT_MANUAL_WAL_FLUSH);
        fdb_get_kvs_info(kvs, &kvs_info);
        TEST_CHK(kvs_info.last_seqnum == (uint64_t)n);

        // start rollback thread
        thread_create(&tid, rollback_during_ops_test, (void *)&n);

        // updates with commits
        for(i=1;i<=10000;i++) {
            sprintf(str, "%d", i);
            status = fdb_set_kv(kvs, str, strlen(str), (void*)"value", 5);
            if(status == FDB_RESULT_SUCCESS){ // set ok
                status = fdb_commit(file, FDB_COMMIT_MANUAL_WAL_FLUSH);
                if(status != FDB_RESULT_SUCCESS){
                    TEST_CHK(status == FDB_RESULT_FAIL_BY_ROLLBACK);
                }
            } else {
                TEST_CHK(status == FDB_RESULT_FAIL_BY_ROLLBACK);
            }
        }

        // join rollback thread
        thread_join(tid, &thread_ret);

        // set a keys commit and save seqnum
        status = fdb_set_kv(kvs,(void *)"key1", 4, (void*)"value", 5);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_commit(file, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_get_kvs_info(kvs, &kvs_info);
        rollback_to = kvs_info.last_seqnum;

        // 2 more sets
        status = fdb_set_kv(kvs,(void *)"key2", 4, (void*)"value", 5);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_set_kv(kvs,(void *)"key3", 4, (void*)"value", 5);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_commit(file, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // rollback to last saved seqnum
        status = fdb_rollback(&kvs, rollback_to);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_get_kvs_info(kvs, &kvs_info);
        TEST_CHK(kvs_info.last_seqnum == rollback_to);

        fdb_close(file);
        fdb_shutdown();

        memleak_end();
        TEST_RESULT("rollback during ops test");
        return NULL;
    }

    // open new copy of dbfile and kvs
    config = fdb_get_default_config();
    // disable block reusing for strict rollback
    config.block_reusing_threshold = 0;
    status = fdb_open(&file, "mvcc_test1", &config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    kvs_config = fdb_get_default_kvs_config();
    status = fdb_kvs_open_default(file, &kvs, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // reverse set with rollbacks
    n = *((int *)args);
    for(i=n;i>1;i--){
        sprintf(str, "%d", i);
        status = fdb_set_kv(kvs, str, strlen(str), (void*)"value", 5);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        if(i%10 == 0){
            status = fdb_rollback(&kvs, i);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    }

    fdb_close(file);
    // exit
    thread_exit(0);
    return NULL;

}